

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  bool bVar1;
  WorkingMode WVar2;
  string *psVar3;
  pointer pcVar4;
  reference this_00;
  reference gti;
  size_type sVar5;
  cmake *pcVar6;
  ostream *poVar7;
  value_type *__x;
  string local_3e0;
  cmAlphaNum local_3c0;
  cmAlphaNum local_390;
  undefined1 local_360 [8];
  string f;
  char **log;
  char *logs [3];
  undefined1 local_318 [8];
  ostringstream msg;
  allocator<char> local_199;
  string local_198;
  char local_178 [8];
  char num [100];
  GlobalTargetInfo *globalTarget;
  iterator __end2;
  iterator __begin2;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *__range2;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *mf;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  *__range1;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  cmMakefile *dirMf;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> local_80;
  __single_object dirMfu;
  cmStateDirectory local_50;
  undefined1 local_28 [8];
  cmStateSnapshot snapshot;
  cmGlobalGenerator *this_local;
  
  this->FirstTimeProgress = 0.0;
  snapshot.Position.Position = (PositionType)this;
  ClearGeneratorMembers(this);
  this->NextDeferId = 0;
  cmake::GetCurrentSnapshot((cmStateSnapshot *)local_28,this->CMakeInstance);
  cmStateSnapshot::GetDirectory(&local_50,(cmStateSnapshot *)local_28);
  psVar3 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentSource(&local_50,psVar3);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&dirMfu,(cmStateSnapshot *)local_28);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&dirMfu,psVar3);
  dirMf = (cmMakefile *)this;
  std::make_unique<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
            ((cmGlobalGenerator **)&local_80,(cmStateSnapshot *)&dirMf);
  pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(&local_80);
  std::
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  ::push_back(&this->Makefiles,&local_80);
  cmMakefile::SetRecursionDepth(pcVar4,this->RecursionDepth);
  IndexMakefile(this,pcVar4);
  psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                          *)&this->BinaryDirectories,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)psVar3,__x);
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure(pcVar4);
  cmMakefile::EnforceDirectoryLevelRules(pcVar4);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::vector((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
            *)&__range1);
  CreateDefaultGlobalTargets
            (this,(vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                   *)&__range1);
  __end1 = std::
           vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ::begin(&this->Makefiles);
  mf = (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
       std::
       vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
       ::end(&this->Makefiles);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_*,_std::vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>_>
                                     *)&mf), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_*,_std::vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>_>
              ::operator*(&__end1);
    __end2 = std::
             vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
             ::begin((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                      *)&__range1);
    globalTarget = (GlobalTargetInfo *)
                   std::
                   vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                   ::end((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                          *)&__range1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
                                       *)&globalTarget), bVar1) {
      gti = __gnu_cxx::
            __normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
            ::operator*(&__end2);
      pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(this_00);
      CreateGlobalTarget(this,gti,pcVar4);
      __gnu_cxx::
      __normal_iterator<cmGlobalGenerator::GlobalTargetInfo_*,_std::vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_*,_std::vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
             *)&__range1);
  sVar5 = std::
          vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
          ::size(&this->Makefiles);
  snprintf(local_178,100,"%d",sVar5 & 0xffffffff);
  pcVar6 = GetCMakeInstance(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"CMAKE_NUMBER_OF_MAKEFILES",&local_199);
  cmake::AddCacheEntry(pcVar6,&local_198,local_178,"number of local generators",4);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  WVar2 = cmake::GetWorkingMode(this->CMakeInstance);
  if (WVar2 == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1) {
      std::operator<<((ostream *)local_318,"Configuring incomplete, errors occurred!");
      log = (char **)anon_var_dwarf_378334;
      logs[0] = "CMakeError.log";
      logs[1] = (char *)0x0;
      for (f.field_2._8_8_ = &log; *(long *)f.field_2._8_8_ != 0;
          f.field_2._8_8_ = f.field_2._8_8_ + 8) {
        psVar3 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
        cmAlphaNum::cmAlphaNum(&local_390,psVar3);
        cmAlphaNum::cmAlphaNum(&local_3c0,"/CMakeFiles/");
        cmStrCat<char_const*>((string *)local_360,&local_390,&local_3c0,(char **)f.field_2._8_8_);
        bVar1 = cmsys::SystemTools::FileExists((string *)local_360);
        if (bVar1) {
          poVar7 = std::operator<<((ostream *)local_318,"\nSee also \"");
          poVar7 = std::operator<<(poVar7,(string *)local_360);
          std::operator<<(poVar7,"\".");
        }
        std::__cxx11::string::~string((string *)local_360);
      }
    }
    else {
      std::operator<<((ostream *)local_318,"Configuring done");
    }
    pcVar6 = this->CMakeInstance;
    std::__cxx11::ostringstream::str();
    cmake::UpdateProgress(pcVar6,&local_3e0,-1.0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  }
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&local_80);
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();
  this->NextDeferId = 0;

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  auto dirMfu = cm::make_unique<cmMakefile>(this, snapshot);
  auto* dirMf = dirMfu.get();
  this->Makefiles.push_back(std::move(dirMfu));
  dirMf->SetRecursionDepth(this->RecursionDepth);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  {
    std::vector<GlobalTargetInfo> globalTargets;
    this->CreateDefaultGlobalTargets(globalTargets);

    for (const auto& mf : this->Makefiles) {
      for (GlobalTargetInfo const& globalTarget : globalTargets) {
        this->CreateGlobalTarget(globalTarget, mf.get());
      }
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  snprintf(num, sizeof(num), "%d", static_cast<int>(this->Makefiles.size()));
  this->GetCMakeInstance()->AddCacheEntry("CMAKE_NUMBER_OF_MAKEFILES", num,
                                          "number of local generators",
                                          cmStateEnums::INTERNAL);

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccurredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = { "CMakeOutput.log", "CMakeError.log", nullptr };
      for (const char** log = logs; *log; ++log) {
        std::string f = cmStrCat(this->CMakeInstance->GetHomeOutputDirectory(),
                                 "/CMakeFiles/", *log);
        if (cmSystemTools::FileExists(f)) {
          msg << "\nSee also \"" << f << "\".";
        }
      }
    } else {
      msg << "Configuring done";
    }
    this->CMakeInstance->UpdateProgress(msg.str(), -1);
  }
}